

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void DynamicContent(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  uint code;
  bool bVar2;
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    pDVar1 = node->tag;
    if (pDVar1 == (Dict *)0x0) {
      code = 0;
      bVar2 = true;
    }
    else {
      bVar2 = pDVar1->id != TidyTag_APPLET;
      code = 0x2d4;
      if (bVar2) {
        code = 0;
      }
      if (bVar2 && pDVar1 != (Dict *)0x0) {
        bVar2 = pDVar1->id != TidyTag_SCRIPT;
        code = 0;
        if (!bVar2) {
          code = 0x2d5;
        }
        if (bVar2 && pDVar1 != (Dict *)0x0) {
          bVar2 = pDVar1->id != TidyTag_OBJECT;
          code = 0x2d6;
          if (bVar2) {
            code = 0;
          }
        }
      }
    }
    if (!bVar2) {
      prvTidyReportAccessError(doc,node,code);
      return;
    }
  }
  return;
}

Assistant:

static void DynamicContent( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        uint msgcode = 0;
        if ( nodeIsAPPLET(node) )
            msgcode = TEXT_EQUIVALENTS_REQUIRE_UPDATING_APPLET;
        else if ( nodeIsSCRIPT(node) )
            msgcode = TEXT_EQUIVALENTS_REQUIRE_UPDATING_SCRIPT;
        else if ( nodeIsOBJECT(node) )
            msgcode = TEXT_EQUIVALENTS_REQUIRE_UPDATING_OBJECT;

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}